

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPCheckParticleCorrect_2
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaParticlePtr item,xmlNodePtr node,int minOccurs,
              int maxOccurs)

{
  xmlAttrPtr pxVar1;
  int maxOccurs_local;
  int minOccurs_local;
  xmlNodePtr node_local;
  xmlSchemaParticlePtr item_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((maxOccurs == 0) && (minOccurs == 0)) {
    return 0;
  }
  if (maxOccurs != 0x40000000) {
    if (maxOccurs < 1) {
      pxVar1 = xmlSchemaGetPropNode(node,"maxOccurs");
      xmlSchemaPCustomAttrErr
                (ctxt,XML_SCHEMAP_P_PROPS_CORRECT_2_2,(xmlChar **)0x0,(xmlSchemaBasicItemPtr)0x0,
                 pxVar1,"The value must be greater than or equal to 1");
      return 0xbe4;
    }
    if (maxOccurs < minOccurs) {
      pxVar1 = xmlSchemaGetPropNode(node,"minOccurs");
      xmlSchemaPCustomAttrErr
                (ctxt,XML_SCHEMAP_P_PROPS_CORRECT_2_1,(xmlChar **)0x0,(xmlSchemaBasicItemPtr)0x0,
                 pxVar1,"The value must not be greater than the value of \'maxOccurs\'");
      return 0xbe3;
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaPCheckParticleCorrect_2(xmlSchemaParserCtxtPtr ctxt,
				 xmlSchemaParticlePtr item ATTRIBUTE_UNUSED,
				 xmlNodePtr node,
				 int minOccurs,
				 int maxOccurs) {

    if ((maxOccurs == 0) && ( minOccurs == 0))
	return (0);
    if (maxOccurs != UNBOUNDED) {
	/*
	* TODO: Maybe we should better not create the particle,
	* if min/max is invalid, since it could confuse the build of the
	* content model.
	*/
	/*
	* 3.9.6 Schema Component Constraint: Particle Correct
	*
	*/
	if (maxOccurs < 1) {
	    /*
	    * 2.2 {max occurs} must be greater than or equal to 1.
	    */
	    xmlSchemaPCustomAttrErr(ctxt,
		XML_SCHEMAP_P_PROPS_CORRECT_2_2,
		NULL, NULL,
		xmlSchemaGetPropNode(node, "maxOccurs"),
		"The value must be greater than or equal to 1");
	    return (XML_SCHEMAP_P_PROPS_CORRECT_2_2);
	} else if (minOccurs > maxOccurs) {
	    /*
	    * 2.1 {min occurs} must not be greater than {max occurs}.
	    */
	    xmlSchemaPCustomAttrErr(ctxt,
		XML_SCHEMAP_P_PROPS_CORRECT_2_1,
		NULL, NULL,
		xmlSchemaGetPropNode(node, "minOccurs"),
		"The value must not be greater than the value of 'maxOccurs'");
	    return (XML_SCHEMAP_P_PROPS_CORRECT_2_1);
	}
    }
    return (0);
}